

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen_nim.cpp
# Opt level: O0

string * __thiscall
flatbuffers::anon_unknown_0::NimBfbsGenerator::Denamespace
          (string *__return_storage_ptr__,NimBfbsGenerator *this,string *s,string *importns,
          string *ns)

{
  bool bVar1;
  ulong uVar2;
  char local_d2 [2];
  char *local_d0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  byte local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_68;
  undefined1 local_41;
  _Self local_40;
  _Self local_38;
  string *local_30;
  string *ns_local;
  string *importns_local;
  string *s_local;
  NimBfbsGenerator *this_local;
  string *type;
  
  local_30 = ns;
  ns_local = importns;
  importns_local = s;
  s_local = (string *)this;
  this_local = (NimBfbsGenerator *)__return_storage_ptr__;
  local_38._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(anonymous_namespace)::builtin_types_abi_cxx11_,s);
  local_40._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(anonymous_namespace)::builtin_types_abi_cxx11_);
  bVar1 = std::operator!=(&local_38,&local_40);
  if (bVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)importns_local);
  }
  else {
    local_41 = 0;
    Namer::Denamespace(&local_68,&(this->namer_).super_Namer,importns_local,local_30,'.');
    Namer::Type(__return_storage_ptr__,&(this->namer_).super_Namer,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    uVar2 = std::__cxx11::string::empty();
    local_b9 = 0;
    if ((uVar2 & 1) == 0) {
      std::operator+(&local_b8,local_30,".");
      local_b9 = 1;
      std::operator+(&local_98,&local_b8,__return_storage_ptr__);
    }
    else {
      std::__cxx11::string::string((string *)&local_98,(string *)__return_storage_ptr__);
    }
    std::__cxx11::string::operator=((string *)ns_local,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    if ((local_b9 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_b8);
    }
    local_c8._M_current = (char *)std::__cxx11::string::begin();
    local_d0 = (char *)std::__cxx11::string::end();
    local_d2[1] = 0x2e;
    local_d2[0] = '_';
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (local_c8,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )local_d0,local_d2 + 1,local_d2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Denamespace(const std::string &s, std::string &importns,
                          std::string &ns) const {
    if (builtin_types.find(s) != builtin_types.end()) { return s; }
    std::string type = namer_.Type(namer_.Denamespace(s, ns));
    importns = ns.empty() ? type : ns + "." + type;
    std::replace(importns.begin(), importns.end(), '.', '_');
    return type;
  }